

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::EmitPropTypeof
          (ByteCodeGenerator *this,RegSlot lhsLocation,Symbol *sym,IdentPtr pid,FuncInfo *funcInfo)

{
  Scope *symScope;
  code *pcVar1;
  ByteCodeGenerator *pBVar2;
  bool bVar3;
  ushort uVar4;
  ProfileId profileId;
  OpCode op;
  PropertyId PVar5;
  uint uVar6;
  RegSlot RVar7;
  ByteCodeLabel labelID;
  Scope **ppSVar8;
  undefined4 *puVar9;
  Scope *scope;
  Type *pTVar10;
  FuncInfo *pFVar11;
  FuncInfo *this_00;
  uint32 slotId;
  int i;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 scopeLocation;
  anon_union_4_2_6390a042_for_DynamicLoadRecord_2 aVar12;
  int index;
  ByteCodeWriter *this_01;
  undefined1 local_b8 [8];
  List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  recList;
  DynamicLoadRecord local_6c;
  undefined4 *local_60;
  Symbol *local_58;
  PropertyId local_50;
  char local_49;
  PropertyId envIndex;
  RegSlot local_3c;
  FuncInfo *local_38;
  
  local_50 = -1;
  ppSVar8 = &sym->scope;
  if (sym == (Symbol *)0x0) {
    ppSVar8 = &this->globalScope;
  }
  symScope = *ppSVar8;
  _envIndex = this;
  local_3c = lhsLocation;
  local_38 = funcInfo;
  if (symScope == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1589,"(symScope)","symScope");
    if (!bVar3) goto LAB_007666af;
    *puVar9 = 0;
  }
  pFVar11 = local_38;
  pBVar2 = _envIndex;
  if ((sym != (Symbol *)0x0) && ((sym->field_0x43 & 0x40) != 0)) {
    RVar7 = FuncInfo::AcquireTmpRegister(local_38);
    pBVar2 = _envIndex;
    EmitModuleExportAccess(_envIndex,sym,LdModuleSlot,RVar7,pFVar11);
    Js::ByteCodeWriter::Reg2(&pBVar2->m_writer,Typeof,local_3c,RVar7);
    FuncInfo::ReleaseTmpRegister(pFVar11,RVar7);
    return;
  }
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>._16_8_ =
       _envIndex->alloc;
  local_b8 = (undefined1  [8])&PTR_IsReadOnly_0137a130;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)0x0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.buffer.
  _0_4_ = 0;
  recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  recList._40_8_ = &sym->scope;
  local_58 = sym;
  local_60 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  this_01 = &pBVar2->m_writer;
  scopeLocation.index = 0xffffffff;
  scope = (Scope *)0x0;
  while( true ) {
    scope = FindScopeForSym(_envIndex,symScope,scope,&local_50,pFVar11);
    aVar12.index = 0xfffffffd;
    if ((scope != this->globalScope) && (aVar12 = scopeLocation, local_50 == -1)) {
      if (scope->func != local_38) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_60 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x159f,"(funcInfo == scope->GetFunc())","funcInfo == scope->GetFunc()");
        if (!bVar3) goto LAB_007666af;
        *local_60 = 0;
      }
      aVar12.instance = scope->location;
    }
    scopeLocation = aVar12;
    if (scope == symScope) break;
    if ((scope == (Scope *)0x0) || (uVar4 = *(ushort *)&scope->field_0x44, (uVar4 & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_60 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x15a9,"(scope && scope->GetIsDynamic())","scope && scope->GetIsDynamic()"
                        );
      if (!bVar3) goto LAB_007666af;
      *local_60 = 0;
      uVar4 = *(ushort *)&scope->field_0x44;
    }
    if ((uVar4 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *local_60 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x15aa,"(scope->GetIsObject())","scope->GetIsObject()");
      if (!bVar3) goto LAB_007666af;
      *local_60 = 0;
    }
    DynamicLoadRecord::DynamicLoadRecord(&local_6c);
    local_6c.label = Js::ByteCodeWriter::DefineLabel(this_01);
    if (local_58 == (Symbol *)0x0) {
      PVar5 = pid->m_propertyId;
    }
    else {
      PVar5 = Symbol::EnsurePosition(local_58,_envIndex);
    }
    uVar6 = FuncInfo::FindOrAddReferencedPropertyId(local_38,PVar5);
    if (scope->scopeType == ScopeType_With) {
      if (local_50 == -1) {
        Js::ByteCodeWriter::BrProperty
                  (this_01,BrOnHasProperty,local_6c.label,scopeLocation.instance,uVar6);
        local_6c.kind = LocalWith;
        local_6c.field_2 = scopeLocation;
      }
      else {
        aVar12.index = local_50 + 1;
        Js::ByteCodeWriter::BrEnvProperty
                  (this_01,BrOnHasEnvProperty,local_6c.label,uVar6,aVar12.index);
        local_6c.kind = EnvWith;
        local_6c.field_2.index = aVar12.index;
      }
    }
    else if (local_50 == -1) {
      Js::ByteCodeWriter::BrLocalProperty(this_01,BrOnHasLocalProperty,local_6c.label,uVar6);
      local_6c.kind = Local;
      local_6c.field_2 = scopeLocation;
    }
    else {
      aVar12.index = local_50 + 1;
      Js::ByteCodeWriter::BrEnvProperty
                (this_01,BrOnHasLocalEnvProperty,local_6c.label,uVar6,aVar12.index);
      local_6c.kind = Env;
      local_6c.field_2.index = aVar12.index;
    }
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    Add((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)local_b8,&local_6c);
    pFVar11 = local_38;
  }
  if (local_58 == (Symbol *)0x0) {
    PVar5 = pid->m_propertyId;
LAB_007662c4:
    if ((_envIndex->flags >> 10 & 1) == 0) {
      if ((_envIndex->flags & 4) == 0) {
        EmitTypeOfFld(_envIndex,local_38,PVar5,local_3c,0xfffffffd,LdRootFldForTypeOf,false);
        goto LAB_007663a4;
      }
LAB_00766321:
      RVar7 = FuncInfo::GetEnvRegister(local_38);
    }
    else {
      if ((((local_38->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) == 0) ||
         (bVar3 = FuncInfo::IsGlobalFunction(local_38), !bVar3)) goto LAB_00766321;
      RVar7 = local_38->frameDisplayRegister;
    }
    EmitTypeOfFld(_envIndex,local_38,PVar5,local_3c,RVar7,ScopedLdFldForTypeOf,false);
  }
  else if (((*(ushort *)&local_58->field_0x42 & 1) == 0) || (scope->func != local_38)) {
    if ((*(ushort *)&local_58->field_0x42 & 8) != 0) {
      PVar5 = Symbol::EnsurePosition(local_58,_envIndex);
      goto LAB_007662c4;
    }
    bVar3 = Symbol::IsInSlot(local_58,_envIndex,local_38,false);
    pFVar11 = local_38;
    if (bVar3 || local_50 != -1) {
      PVar5 = Symbol::EnsureScopeSlot(local_58,_envIndex,local_38);
      profileId = FuncInfo::FindOrAddSlotProfileId(pFVar11,scope,PVar5);
      this_00 = pFVar11;
      RVar7 = FuncInfo::AcquireTmpRegister(pFVar11);
      local_49 = NeedCheckBlockVar((ByteCodeGenerator *)this_00,local_58,scope,pFVar11);
      op = GetLdSlotOp((ByteCodeGenerator *)this_00,scope,local_50,scopeLocation.instance,pFVar11);
      slotId = PVar5 + (~*(uint *)(*(long *)recList._40_8_ + 0x44) & 2);
      if (local_50 == -1) {
        if ((scopeLocation.index == 0xffffffff) ||
           ((scopeLocation.index != local_38->frameSlotsRegister &&
            (scopeLocation.index != local_38->frameObjRegister)))) {
          uVar6 = scope->innerScopeIndex;
          if (uVar6 != 0xffffffff) goto LAB_00766211;
          if ((scope->field_0x44 & 2) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *local_60 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x1614,"(scope->GetIsObject())","scope->GetIsObject()");
            if (!bVar3) {
LAB_007666af:
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *local_60 = 0;
          }
          Js::ByteCodeWriter::Slot(this_01,op,RVar7,scopeLocation.instance,slotId,profileId);
        }
        else {
          Js::ByteCodeWriter::SlotI1(this_01,op,RVar7,slotId,profileId);
        }
      }
      else {
        uVar6 = local_50 + 1;
LAB_00766211:
        Js::ByteCodeWriter::SlotI2(this_01,op,RVar7,uVar6,slotId,profileId);
      }
      if (local_49 != '\0') {
        Js::ByteCodeWriter::Reg1(this_01,ChkUndecl,RVar7);
      }
      Js::ByteCodeWriter::Reg2(this_01,Typeof,local_3c,RVar7);
      FuncInfo::ReleaseTmpRegister(local_38,RVar7);
    }
    else {
      Js::ByteCodeWriter::Reg2(this_01,Typeof,local_3c,local_58->location);
    }
  }
  else {
    bVar3 = Symbol::IsInSlot(local_58,_envIndex,local_38,false);
    if (bVar3) {
      PVar5 = Symbol::EnsureScopeSlot(local_58,_envIndex,local_38);
      FuncInfo::FindOrAddSlotProfileId(local_38,scope,PVar5);
    }
    EmitUseBeforeDeclarationRuntimeError(_envIndex,local_3c);
  }
LAB_007663a4:
  if ((int)recList.super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
           buffer == 0) goto LAB_007665e7;
  labelID = Js::ByteCodeWriter::DefineLabel(this_01);
  Js::ByteCodeWriter::Br(this_01,labelID);
  index = 0;
LAB_007663c8:
  if (local_58 == (Symbol *)0x0) {
    PVar5 = pid->m_propertyId;
  }
  else {
    PVar5 = Symbol::EnsurePosition(local_58,_envIndex);
  }
  pTVar10 = JsUtil::
            List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    *)local_b8,index);
  Js::ByteCodeWriter::MarkLabel(this_01,pTVar10->label);
  pTVar10 = JsUtil::
            List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    *)local_b8,index);
  switch(pTVar10->kind) {
  case Local:
    pTVar10 = JsUtil::
              List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      *)local_b8,index);
    EmitTypeOfFld(_envIndex,local_38,PVar5,local_3c,(pTVar10->field_2).instance,LdLocalFld,true);
    goto LAB_007665be;
  case Env:
    RVar7 = FuncInfo::AcquireTmpRegister(local_38);
    pTVar10 = JsUtil::
              List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      *)local_b8,index);
    Js::ByteCodeWriter::SlotI1(this_01,LdEnvObj,RVar7,(pTVar10->field_2).index);
    EmitTypeOfFld(_envIndex,local_38,PVar5,local_3c,RVar7,LdFldForTypeOf,true);
    break;
  case LocalWith:
    RVar7 = FuncInfo::AcquireTmpRegister(local_38);
    pTVar10 = JsUtil::
              List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      *)local_b8,index);
    Js::ByteCodeWriter::Reg2(this_01,UnwrapWithObj,RVar7,(pTVar10->field_2).instance);
    EmitTypeOfFld(_envIndex,local_38,PVar5,local_3c,RVar7,LdFldForTypeOf,true);
    break;
  case EnvWith:
    RVar7 = FuncInfo::AcquireTmpRegister(local_38);
    pTVar10 = JsUtil::
              List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      *)local_b8,index);
    Js::ByteCodeWriter::SlotI1(this_01,LdEnvObj,RVar7,(pTVar10->field_2).index);
    Js::ByteCodeWriter::Reg2(this_01,UnwrapWithObj,RVar7,RVar7);
    EmitTypeOfFld(_envIndex,local_38,PVar5,local_3c,RVar7,LdFldForTypeOf,true);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *local_60 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x164d,"((0))","(0)");
    if (bVar3) {
      *local_60 = 0;
      goto LAB_007665be;
    }
    goto LAB_007666af;
  }
  FuncInfo::ReleaseTmpRegister(local_38,RVar7);
LAB_007665be:
  if (index == (int)recList.
                    super_ReadOnlyList<DynamicLoadRecord,_Memory::ArenaAllocator,_DefaultComparer>.
                    buffer + -1) {
    Js::ByteCodeWriter::MarkLabel(this_01,labelID);
LAB_007665e7:
    JsUtil::
    List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
    ~List((List<DynamicLoadRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)local_b8);
    return;
  }
  Js::ByteCodeWriter::Br(this_01,labelID);
  index = index + 1;
  goto LAB_007663c8;
}

Assistant:

void ByteCodeGenerator::EmitPropTypeof(Js::RegSlot lhsLocation, Symbol *sym, IdentPtr pid, FuncInfo *funcInfo)
{
    // If sym belongs to a parent frame, delete it from the closure environment.
    // If it belongs to this func, but there's a non-local reference, get it from the heap-allocated frame.
    // (TODO: optimize this by getting the sym from its normal location if there are no non-local defs.)
    // Otherwise, just return false

    Js::RegSlot scopeLocation = Js::Constants::NoRegister;
    Js::PropertyId envIndex = -1;
    Scope *scope = nullptr;
    Scope *symScope = sym ? sym->GetScope() : this->globalScope;
    Assert(symScope);

    if (sym && sym->GetIsModuleExportStorage())
    {
        Js::RegSlot tmpLocation = funcInfo->AcquireTmpRegister();
        EmitModuleExportAccess(sym, Js::OpCode::LdModuleSlot, tmpLocation, funcInfo);
        this->m_writer.Reg2(Js::OpCode::Typeof, lhsLocation, tmpLocation);
        funcInfo->ReleaseTmpRegister(tmpLocation);
        return;
    }

    JsUtil::List<DynamicLoadRecord, ArenaAllocator> recList(this->alloc);

    for (;;)
    {
        scope = this->FindScopeForSym(symScope, scope, &envIndex, funcInfo);
        if (scope == this->globalScope)
        {
            scopeLocation = ByteCodeGenerator::RootObjectRegister;
        }
        else if (envIndex == -1)
        {
            Assert(funcInfo == scope->GetFunc());
            scopeLocation = scope->GetLocation();
        }

        if (scope == symScope)
        {
            break;
        }

        // Found a scope to which the property may have been added.
        Assert(scope && scope->GetIsDynamic());
        AssertOrFailFast(scope->GetIsObject());

        DynamicLoadRecord rec;

        rec.label = this->m_writer.DefineLabel();
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        Js::PropertyIdIndexType propertyIndex = funcInfo->FindOrAddReferencedPropertyId(propertyId);

        if (scope->GetScopeType() != ScopeType_With)
        {
            if (envIndex == -1)
            {
                this->m_writer.BrLocalProperty(Js::OpCode::BrOnHasLocalProperty, rec.label, propertyIndex);
                rec.kind = DynamicLoadKind::Local;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasLocalEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::Env;
                rec.index = frameDisplayIndex;
            }
        }
        else
        {
            if (envIndex == -1)
            {
                this->m_writer.BrProperty(Js::OpCode::BrOnHasProperty, rec.label, scopeLocation, propertyIndex);
                rec.kind = DynamicLoadKind::LocalWith;
                rec.instance = scopeLocation;
            }
            else
            {
                uint32 frameDisplayIndex = envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var);
                this->m_writer.BrEnvProperty(Js::OpCode::BrOnHasEnvProperty, rec.label, propertyIndex, frameDisplayIndex);
                rec.kind = DynamicLoadKind::EnvWith;
                rec.index = frameDisplayIndex;
            }
        }

        recList.Add(rec);
    }

    // Arrived at the scope in which the property was defined.
    if (sym && sym->GetNeedDeclaration() && scope->GetFunc() == funcInfo)
    {
        // Ensure this symbol has a slot if it needs one.
        if (sym->IsInSlot(this, funcInfo))
        {
            Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
            funcInfo->FindOrAddSlotProfileId(scope, slot);
        }

        EmitUseBeforeDeclarationRuntimeError(this, lhsLocation);
    }
    else if (sym == nullptr || sym->GetIsGlobal())
    {
        Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();
        if (this->flags & fscrEval)
        {
            if (funcInfo->byteCodeFunction->GetIsStrictMode() && funcInfo->IsGlobalFunction())
            {
                this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, funcInfo->frameDisplayRegister, Js::OpCode::ScopedLdFldForTypeOf);
            }
            else
            {
                this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, funcInfo->GetEnvRegister(), Js::OpCode::ScopedLdFldForTypeOf);
            }
        }
        else if (this->flags & fscrImplicitThis)
        {
            this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, funcInfo->GetEnvRegister(), Js::OpCode::ScopedLdFldForTypeOf);
        }
        else
        {
            this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, ByteCodeGenerator::RootObjectRegister, Js::OpCode::LdRootFldForTypeOf);
        }
    }
    else if (sym->IsInSlot(this, funcInfo) || envIndex != -1)
    {
        // Make sure the property has a slot. This will bump up the size of the slot array if necessary.
        Js::PropertyId slot = sym->EnsureScopeSlot(this, funcInfo);
        Js::ProfileId profileId = funcInfo->FindOrAddSlotProfileId(scope, slot);
        Js::RegSlot tmpLocation = funcInfo->AcquireTmpRegister();
        bool chkBlockVar = NeedCheckBlockVar(sym, scope, funcInfo);
        Js::OpCode op;

        op = this->GetLdSlotOp(scope, envIndex, scopeLocation, funcInfo);
        slot = slot + (sym->GetScope()->GetIsObject() ? 0 : Js::ScopeSlots::FirstSlotIndex);

        if (envIndex != -1)
        {
            this->m_writer.SlotI2(op, tmpLocation, envIndex + Js::FrameDisplay::GetOffsetOfScopes() / sizeof(Js::Var), slot, profileId);
        }
        else if (scopeLocation != Js::Constants::NoRegister &&
            (scopeLocation == funcInfo->frameSlotsRegister || scopeLocation == funcInfo->frameObjRegister))
        {
            this->m_writer.SlotI1(op, tmpLocation, slot, profileId);
        }
        else if (scope->HasInnerScopeIndex())
        {
            this->m_writer.SlotI2(op, tmpLocation, scope->GetInnerScopeIndex(), slot, profileId);
        }
        else
        {
            AssertOrFailFast(scope->GetIsObject());
            this->m_writer.Slot(op, tmpLocation, scopeLocation, slot, profileId);
        }

        if (chkBlockVar)
        {
            this->m_writer.Reg1(Js::OpCode::ChkUndecl, tmpLocation);
        }

        this->m_writer.Reg2(Js::OpCode::Typeof, lhsLocation, tmpLocation);
        funcInfo->ReleaseTmpRegister(tmpLocation);
    }
    else
    {
        this->m_writer.Reg2(Js::OpCode::Typeof, lhsLocation, sym->GetLocation());
    }

    if (!recList.Empty())
    {
        Js::ByteCodeLabel doneLabel = this->m_writer.DefineLabel();
        this->m_writer.Br(doneLabel);

        for (int i = 0;; i++)
        {
            Js::RegSlot instLocation;
            Js::PropertyId propertyId = sym ? sym->EnsurePosition(this) : pid->GetPropertyId();

            this->m_writer.MarkLabel(recList.Item(i).label);
            switch(recList.Item(i).kind)
            {
                case DynamicLoadKind::Local:
                    this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, recList.Item(i).instance, Js::OpCode::LdLocalFld, true);
                    break;

                case DynamicLoadKind::Env:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, instLocation, Js::OpCode::LdFldForTypeOf, true);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::LocalWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, recList.Item(i).instance);
                    this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, instLocation, Js::OpCode::LdFldForTypeOf, true);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                case DynamicLoadKind::EnvWith:
                    instLocation = funcInfo->AcquireTmpRegister();
                    this->m_writer.SlotI1(Js::OpCode::LdEnvObj, instLocation, recList.Item(i).index);
                    this->m_writer.Reg2(Js::OpCode::UnwrapWithObj, instLocation, instLocation);
                    this->EmitTypeOfFld(funcInfo, propertyId, lhsLocation, instLocation, Js::OpCode::LdFldForTypeOf, true);
                    funcInfo->ReleaseTmpRegister(instLocation);
                    break;

                default:
                    AssertOrFailFast(UNREACHED);
            }

            if (i == recList.Count() - 1)
            {
                break;
            }
            this->m_writer.Br(doneLabel);
        }

        this->m_writer.MarkLabel(doneLabel);
    }
}